

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ios_prop.h
# Opt level: O1

void booster::locale::impl::ios_prop<booster::locale::ios_info>::set(ios_info *prop,ios_base *ios)

{
  uint uVar1;
  long *plVar2;
  undefined8 *puVar3;
  ios_info *piVar4;
  bool bVar5;
  int iVar6;
  
  uVar1 = get_id();
  bVar5 = SUB41(uVar1,0);
  iVar6 = (int)ios;
  if (uVar1 < *(uint *)(ios + 0xc0)) {
    plVar2 = (long *)((long)(int)uVar1 * 0x10 + *(long *)(ios + 200));
  }
  else {
    plVar2 = (long *)std::ios_base::_M_grow_words(iVar6,bVar5);
  }
  if (*plVar2 == 0) {
    piVar4 = (ios_info *)operator_new(0x50);
    ios_info::ios_info(piVar4,prop);
    if (uVar1 < *(uint *)(ios + 0xc0)) {
      puVar3 = (undefined8 *)((long)(int)uVar1 * 0x10 + *(long *)(ios + 200));
    }
    else {
      puVar3 = (undefined8 *)std::ios_base::_M_grow_words(iVar6,bVar5);
    }
    *puVar3 = piVar4;
    std::ios_base::register_callback((_func_void_event_ios_base_ptr_int *)ios,0x170864);
    return;
  }
  if (uVar1 < *(uint *)(ios + 0xc0)) {
    plVar2 = (long *)((long)(int)uVar1 * 0x10 + *(long *)(ios + 200));
  }
  else {
    plVar2 = (long *)std::ios_base::_M_grow_words(iVar6,bVar5);
  }
  if (*plVar2 != -1) {
    if (uVar1 < *(uint *)(ios + 0xc0)) {
      puVar3 = (undefined8 *)((long)(int)uVar1 * 0x10 + *(long *)(ios + 200));
    }
    else {
      puVar3 = (undefined8 *)std::ios_base::_M_grow_words(iVar6,bVar5);
    }
    ios_info::operator=((ios_info *)*puVar3,prop);
    return;
  }
  piVar4 = (ios_info *)operator_new(0x50);
  ios_info::ios_info(piVar4,prop);
  if (uVar1 < *(uint *)(ios + 0xc0)) {
    puVar3 = (undefined8 *)((long)(int)uVar1 * 0x10 + *(long *)(ios + 200));
  }
  else {
    puVar3 = (undefined8 *)std::ios_base::_M_grow_words(iVar6,bVar5);
  }
  *puVar3 = piVar4;
  return;
}

Assistant:

static void set(Property const &prop,std::ios_base &ios)
                {
                    int id=get_id();
                    if(ios.pword(id)==0) {
                        ios.pword(id) = new Property(prop);
                        ios.register_callback(callback,id);
                    }
                    else if(ios.pword(id)==invalid) {
                        ios.pword(id) = new Property(prop);
                    }
                    else {
                        *static_cast<Property *>(ios.pword(id))=prop;
                    }
                }